

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::Variable::declareArray
          (string *__return_storage_ptr__,Variable *this,string *sizeExpr)

{
  string sStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  DeclareVariable local_58;
  
  glu::decl::DeclareVariable::DeclareVariable(&local_58,&this->m_type,&this->m_name,0);
  de::toString<glu::decl::DeclareVariable>(&sStack_b8,&local_58);
  std::operator+(&local_98,&sStack_b8,"[");
  std::operator+(&local_78,&local_98,sizeExpr);
  std::operator+(__return_storage_ptr__,&local_78,"];\n");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&sStack_b8);
  glu::decl::DeclareVariable::~DeclareVariable(&local_58);
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::Variable::declareArray (const string& sizeExpr) const
{
	DE_ASSERT(m_isArray);
	return de::toString(glu::declare(m_type, m_name)) + "[" + sizeExpr + "];\n";
}